

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Message * __thiscall
google::protobuf::Reflection::ReleaseLast(Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  Descriptor *pDVar4;
  Reflection *in_RDX;
  Message *in_RDI;
  char *in_stack_00000058;
  char *in_stack_00000060;
  undefined4 in_stack_00000068;
  CppType in_stack_0000006c;
  Descriptor *in_stack_00000070;
  FieldDescriptor *in_stack_00000078;
  Descriptor *in_stack_00000080;
  int in_stack_000000dc;
  ExtensionSet *in_stack_000000e0;
  Message *in_stack_ffffffffffffffc8;
  Reflection *in_stack_ffffffffffffffd0;
  MessageLite *local_8;
  
  pDVar4 = FieldDescriptor::containing_type((FieldDescriptor *)in_RDX);
  if (pDVar4 != (Descriptor *)(in_RDI->super_MessageLite)._vptr_MessageLite) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000070,(FieldDescriptor *)CONCAT44(in_stack_0000006c,in_stack_00000068),
               in_stack_00000060,in_stack_00000058);
  }
  LVar2 = FieldDescriptor::label((FieldDescriptor *)in_RDX);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000070,(FieldDescriptor *)CONCAT44(in_stack_0000006c,in_stack_00000068),
               in_stack_00000060,in_stack_00000058);
  }
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x42690a);
  if (CVar3 != CPPTYPE_MESSAGE) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (in_stack_00000080,in_stack_00000078,(char *)in_stack_00000070,in_stack_0000006c);
  }
  bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)in_RDX);
  if (bVar1) {
    MutableExtensionSet(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    FieldDescriptor::number((FieldDescriptor *)in_RDX);
    local_8 = internal::ExtensionSet::ReleaseLast(in_stack_000000e0,in_stack_000000dc);
  }
  else {
    bVar1 = anon_unknown_0::IsMapFieldInApi((FieldDescriptor *)0x426978);
    if (bVar1) {
      MutableRaw<google::protobuf::internal::MapFieldBase>
                (in_RDX,in_RDI,(FieldDescriptor *)in_stack_ffffffffffffffd0);
      internal::MapFieldBase::MutableRepeatedField((MapFieldBase *)in_stack_ffffffffffffffd0);
      local_8 = &internal::RepeatedPtrFieldBase::
                 ReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                           ((RepeatedPtrFieldBase *)in_stack_ffffffffffffffd0)->super_MessageLite;
    }
    else {
      MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>
                (in_RDX,in_RDI,(FieldDescriptor *)in_stack_ffffffffffffffd0);
      local_8 = &internal::RepeatedPtrFieldBase::
                 ReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                           ((RepeatedPtrFieldBase *)in_stack_ffffffffffffffd0)->super_MessageLite;
    }
  }
  return (Message *)local_8;
}

Assistant:

Message* Reflection::ReleaseLast(Message* message,
                                 const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(ReleaseLast, REPEATED, MESSAGE);

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->ReleaseLast(field->number()));
  } else {
    if (IsMapFieldInApi(field)) {
      return MutableRaw<MapFieldBase>(message, field)
          ->MutableRepeatedField()
          ->ReleaseLast<GenericTypeHandler<Message> >();
    } else {
      return MutableRaw<RepeatedPtrFieldBase>(message, field)
          ->ReleaseLast<GenericTypeHandler<Message> >();
    }
  }
}